

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall iDynTree::Model::Model(Model *this)

{
  undefined8 *in_RDI;
  SensorsList *this_00;
  
  *in_RDI = &PTR__Model_004fa128;
  std::vector<iDynTree::Link,_std::allocator<iDynTree::Link>_>::vector
            ((vector<iDynTree::Link,_std::allocator<iDynTree::Link>_> *)0x446edf);
  std::vector<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>::vector
            ((vector<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_> *)0x446ef2);
  std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::vector
            ((vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)0x446f05);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x446f18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x446f2b);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x446f3e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x446f54);
  std::
  vector<std::vector<iDynTree::Neighbor,_std::allocator<iDynTree::Neighbor>_>,_std::allocator<std::vector<iDynTree::Neighbor,_std::allocator<iDynTree::Neighbor>_>_>_>
  ::vector((vector<std::vector<iDynTree::Neighbor,_std::allocator<iDynTree::Neighbor>_>,_std::allocator<std::vector<iDynTree::Neighbor,_std::allocator<iDynTree::Neighbor>_>_>_>
            *)0x446f6a);
  this_00 = (SensorsList *)(in_RDI + 0x19);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x446f80);
  in_RDI[0x1c] = LINK_INVALID_INDEX;
  *(undefined4 *)(in_RDI + 0x1d) = 0;
  *(undefined4 *)((long)in_RDI + 0xec) = 0;
  ModelSolidShapes::ModelSolidShapes((ModelSolidShapes *)0x446fbb);
  ModelSolidShapes::ModelSolidShapes((ModelSolidShapes *)0x446fd2);
  SensorsList::SensorsList(this_00);
  return;
}

Assistant:

Model::Model()
    : defaultBaseLink(LINK_INVALID_INDEX)
    , nrOfPosCoords(0)
    , nrOfDOFs(0)
{

}